

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::UninterpretedOption::SharedCtor(UninterpretedOption *this)

{
  UninterpretedOption *this_local;
  
  this->_cached_size_ = 0;
  this->identifier_value_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->positive_int_value_ = 0;
  this->negative_int_value_ = 0;
  this->double_value_ = 0.0;
  this->string_value_ = (string *)internal::kEmptyString_abi_cxx11_;
  this->aggregate_value_ = (string *)internal::kEmptyString_abi_cxx11_;
  memset(this->_has_bits_,0,4);
  return;
}

Assistant:

void UninterpretedOption::SharedCtor() {
  _cached_size_ = 0;
  identifier_value_ = const_cast< ::std::string*>(&::google::protobuf::internal::kEmptyString);
  positive_int_value_ = GOOGLE_ULONGLONG(0);
  negative_int_value_ = GOOGLE_LONGLONG(0);
  double_value_ = 0;
  string_value_ = const_cast< ::std::string*>(&::google::protobuf::internal::kEmptyString);
  aggregate_value_ = const_cast< ::std::string*>(&::google::protobuf::internal::kEmptyString);
  ::memset(_has_bits_, 0, sizeof(_has_bits_));
}